

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  uint uVar11;
  int num_vertices;
  int iVar12;
  ulong uVar13;
  stbtt_vertex *vertices;
  ushort *puVar14;
  stbtt_vertex *__dest;
  int iVar15;
  long lVar16;
  short sVar17;
  int cy;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 auVar22 [8];
  uint uVar23;
  long lVar24;
  byte bVar25;
  byte bVar26;
  ushort uVar27;
  short sVar28;
  stbtt_vertex *psVar29;
  uint uVar30;
  ushort *puVar32;
  int iVar33;
  int iVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  float fVar45;
  int cx;
  ulong local_a8;
  ulong local_a0;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  stbtt_vertex *comp_verts;
  stbtt_vertex **local_40;
  uchar *local_38;
  ulong uVar21;
  ulong uVar31;
  
  puVar4 = info->data;
  uVar11 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  if ((int)uVar11 < 0) {
LAB_00137ceb:
    uVar11 = 0;
  }
  else {
    uVar13 = (ulong)uVar11;
    uVar10 = CONCAT11(puVar4[uVar13],puVar4[uVar13 + 1]);
    local_40 = pvertices;
    if ((short)uVar10 < 1) {
      if (uVar10 == 0xffff) {
        uVar19 = 0;
        vertices = (stbtt_vertex *)0x0;
        puVar14 = (ushort *)(puVar4 + uVar13 + 10);
        for (bVar26 = 1; uVar11 = (uint)uVar19, bVar26 != 0; bVar26 = bVar26 & 0x20) {
          comp_verts = (stbtt_vertex *)0x0;
          bVar26 = *(byte *)((long)puVar14 + 1);
          if ((bVar26 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                          ,0x586,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar26 & 1) == 0) {
            iVar15 = (int)(char)puVar14[2];
            iVar36 = (int)((long)((ulong)*(byte *)((long)puVar14 + 5) << 0x38) >> 0x38);
            lVar16 = 6;
          }
          else {
            auVar6._9_7_ = 0;
            auVar6._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
            auVar5._10_6_ = 0;
            auVar5._0_10_ = SUB1610(auVar6 << 0x38,6);
            auVar41._11_5_ = 0;
            auVar41._0_11_ = SUB1611(auVar5 << 0x30,5);
            auVar7._1_12_ = SUB1612(auVar41 << 0x28,4);
            auVar7[0] = (char)puVar14[3];
            auVar7._13_3_ = 0;
            auVar35._1_14_ = SUB1614(auVar7 << 0x18,2);
            auVar35[0] = (char)puVar14[2];
            auVar35[0xf] = 0;
            auVar35 = ZEXT416((uint)*(byte *)((long)puVar14 + 7) << 0x10 |
                              (uint)*(byte *)((long)puVar14 + 5)) | auVar35 << 8;
            iVar15 = (int)auVar35._0_2_;
            iVar36 = (int)auVar35._2_2_;
            lVar16 = 8;
          }
          puVar32 = (ushort *)(lVar16 + (long)puVar14);
          if ((bVar26 & 8) == 0) {
            if ((bVar26 & 0x40) != 0) {
              uVar10 = *puVar32;
              fVar38 = (float)(int)(short)(puVar32[1] << 8 | puVar32[1] >> 8) * 6.1035156e-05;
              puVar32 = puVar32 + 2;
              _local_68 = ZEXT416((uint)((float)(int)(short)(uVar10 << 8 | uVar10 >> 8) *
                                        6.1035156e-05));
              goto LAB_00137ae0;
            }
            if ((char)bVar26 < '\0') {
              local_68._0_4_ =
                   (float)(int)CONCAT11((char)*puVar32,*(undefined1 *)((long)puVar32 + 1)) *
                   6.1035156e-05;
              local_68._4_4_ =
                   (float)(int)((long)((ulong)CONCAT11((char)puVar32[2],
                                                       *(undefined1 *)((long)puVar32 + 5)) << 0x30)
                               >> 0x30) * 6.1035156e-05;
              _fStack_60 = 0;
              local_78._0_4_ =
                   (float)(int)CONCAT11((char)puVar32[1],*(undefined1 *)((long)puVar32 + 3)) *
                   6.1035156e-05;
              local_78._4_4_ =
                   (float)(int)((long)((ulong)CONCAT11((char)puVar32[3],
                                                       *(undefined1 *)((long)puVar32 + 7)) << 0x30)
                               >> 0x30) * 6.1035156e-05;
              local_78._8_8_ = 0;
              puVar32 = puVar32 + 4;
            }
            else {
              _local_68 = ZEXT812(0x3f800000);
              fStack_5c = 0.0;
              local_78 = ZEXT816(0x3f80000000000000);
            }
          }
          else {
            fVar38 = (float)(int)(short)(*puVar32 << 8 | *puVar32 >> 8) * 6.1035156e-05;
            puVar32 = puVar32 + 1;
            register0x00001244 = SUB1612((undefined1  [16])0x0,4);
            local_68._0_4_ = fVar38;
LAB_00137ae0:
            local_78 = ZEXT416((uint)fVar38) << 0x20;
          }
          uVar23 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar14[1] << 8 | puVar14[1] >> 8),
                                       &comp_verts);
          psVar29 = comp_verts;
          if (0 < (int)uVar23) {
            fVar38 = local_78._0_4_;
            fVar42 = local_78._4_4_;
            auVar34._0_4_ = fVar38 * fVar38;
            auVar34._4_4_ = fVar42 * fVar42;
            auVar34._8_4_ = local_78._8_4_ * local_78._8_4_;
            auVar34._12_4_ = local_78._12_4_ * local_78._12_4_;
            auVar37._0_4_ = (float)local_68._0_4_ * (float)local_68._0_4_ + auVar34._0_4_;
            auVar37._4_4_ = (float)local_68._4_4_ * (float)local_68._4_4_ + auVar34._4_4_;
            auVar37._8_4_ = fStack_60 * fStack_60 + auVar34._8_4_;
            auVar37._12_4_ = fStack_5c * fStack_5c + auVar34._12_4_;
            auVar35 = sqrtps(auVar34,auVar37);
            for (lVar16 = 0; (ulong)uVar23 * 10 - lVar16 != 0; lVar16 = lVar16 + 10) {
              fVar39 = (float)(int)*(short *)((long)&comp_verts->x + lVar16);
              fVar43 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cx + lVar16) <<
                                          0x30) >> 0x30);
              fVar44 = (float)(int)*(short *)((long)&comp_verts->y + lVar16);
              fVar45 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cy + lVar16) <<
                                          0x30) >> 0x30);
              auVar40._0_4_ =
                   (int)((fVar44 * (float)local_68._4_4_ + fVar39 * (float)local_68._0_4_ +
                         (float)iVar15) * auVar35._0_4_);
              auVar40._4_4_ =
                   (int)((fVar44 * fVar42 + fVar39 * fVar38 + (float)iVar36) * auVar35._4_4_);
              auVar40._8_4_ =
                   (int)((fVar45 * (float)local_68._4_4_ + fVar43 * (float)local_68._0_4_ +
                         (float)iVar15) * auVar35._0_4_);
              auVar40._12_4_ =
                   (int)((fVar45 * fVar42 + fVar43 * fVar38 + (float)iVar36) * auVar35._4_4_);
              auVar41 = packssdw(auVar40,auVar40);
              *(long *)((long)&comp_verts->x + lVar16) = auVar41._0_8_;
            }
            __dest = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar23 + uVar11) * 10);
            if (__dest == (stbtt_vertex *)0x0) {
              if (vertices != (stbtt_vertex *)0x0) {
                ImGui::MemFree(vertices);
              }
              if (psVar29 != (stbtt_vertex *)0x0) {
                ImGui::MemFree(psVar29);
              }
              goto LAB_00137ceb;
            }
            if (0 < (int)uVar11) {
              memcpy(__dest,vertices,uVar19 * 10);
            }
            memcpy(__dest + uVar19,psVar29,(ulong)uVar23 * 10);
            if (vertices != (stbtt_vertex *)0x0) {
              ImGui::MemFree(vertices);
            }
            ImGui::MemFree(psVar29);
            vertices = __dest;
            uVar11 = uVar23 + uVar11;
          }
          uVar19 = (ulong)uVar11;
          puVar14 = puVar32;
        }
      }
      else {
        if ((short)((ushort)puVar4[uVar13] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                        ,0x5bb,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        uVar11 = 0;
        vertices = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar11 = (uint)uVar10 * 2;
      uVar19 = (ulong)uVar11;
      bVar26 = puVar4[uVar19 + uVar13 + 10];
      bVar25 = puVar4[uVar19 + uVar13 + 0xb];
      bVar1 = puVar4[uVar19 + uVar13 + 8];
      bVar2 = puVar4[uVar19 + uVar13 + 9];
      iVar15 = (uint)bVar1 * 0x100 + (uint)bVar2;
      vertices = (stbtt_vertex *)ImGui::MemAlloc((ulong)((iVar15 + (uint)uVar10 * 2) * 10 + 10));
      if (vertices == (stbtt_vertex *)0x0) {
        return 0;
      }
      local_38 = puVar4 + uVar13 + 10;
      puVar14 = (ushort *)(puVar4 + (ulong)bVar26 * 0x100 + (ulong)bVar25 + uVar19 + uVar13 + 0xc);
      uVar19 = uVar19 & 0xffff;
      lVar16 = (ulong)(CONCAT11(bVar1,bVar2) + 1) * 10;
      bVar25 = 0;
      bVar26 = 0;
      for (lVar24 = 0; lVar16 - lVar24 != 0; lVar24 = lVar24 + 10) {
        if (bVar25 == 0) {
          bVar26 = (byte)*puVar14;
          if ((bVar26 & 8) == 0) {
            puVar14 = (ushort *)((long)puVar14 + 1);
            bVar25 = 0;
          }
          else {
            bVar25 = *(byte *)((long)puVar14 + 1);
            puVar14 = puVar14 + 1;
          }
        }
        else {
          bVar25 = bVar25 - 1;
        }
        (&vertices[uVar19].type)[lVar24] = bVar26;
      }
      sVar28 = 0;
      for (lVar24 = 0; lVar16 - lVar24 != 0; lVar24 = lVar24 + 10) {
        bVar26 = (&vertices[uVar19].type)[lVar24];
        if ((bVar26 & 2) == 0) {
          if ((bVar26 & 0x10) == 0) {
            sVar28 = sVar28 + (*puVar14 << 8 | *puVar14 >> 8);
            puVar14 = puVar14 + 1;
          }
        }
        else {
          uVar10 = *puVar14;
          puVar14 = (ushort *)((long)puVar14 + 1);
          uVar27 = -(ushort)(byte)uVar10;
          if ((bVar26 & 0x10) != 0) {
            uVar27 = (ushort)(byte)uVar10;
          }
          sVar28 = sVar28 + uVar27;
        }
        *(short *)((long)&vertices[uVar19].x + lVar24) = sVar28;
      }
      sVar28 = 0;
      for (lVar24 = 0; lVar16 - lVar24 != 0; lVar24 = lVar24 + 10) {
        bVar26 = (&vertices[uVar19].type)[lVar24];
        if ((bVar26 & 4) == 0) {
          if ((bVar26 & 0x20) == 0) {
            sVar28 = sVar28 + (*puVar14 << 8 | *puVar14 >> 8);
            puVar14 = puVar14 + 1;
          }
        }
        else {
          uVar10 = *puVar14;
          puVar14 = (ushort *)((long)puVar14 + 1);
          uVar27 = -(ushort)(byte)uVar10;
          if ((bVar26 & 0x20) != 0) {
            uVar27 = (ushort)(byte)uVar10;
          }
          sVar28 = sVar28 + uVar27;
        }
        *(short *)((long)&vertices[uVar19].y + lVar24) = sVar28;
      }
      iVar36 = 0;
      uVar23 = 0;
      local_a0 = 0;
      local_a8 = 0;
      uVar13 = 0;
      uVar19 = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_68;
      _local_68 = auVar8 << 0x40;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_78._0_8_;
      local_78 = auVar9 << 0x40;
      iVar33 = 0;
      iVar18 = 0;
      iVar12 = 0;
      num_vertices = 0;
      while( true ) {
        cy = (int)local_a8;
        cx = (int)local_a0;
        if (iVar15 < iVar12) break;
        lVar16 = (long)(int)(iVar12 + uVar11);
        bVar26 = vertices[lVar16].type;
        sVar28 = vertices[lVar16].x;
        sVar3 = vertices[lVar16].y;
        uVar20 = (uint)sVar28;
        uVar21 = (ulong)uVar20;
        uVar30 = (uint)sVar3;
        uVar31 = (ulong)uVar30;
        if (iVar33 == iVar12) {
          if (iVar33 != 0) {
            num_vertices = stbtt__close_shape(vertices,num_vertices,iVar36,uVar23,
                                              (stbtt_int32)uVar13,(stbtt_int32)uVar19,local_68._0_4_
                                              ,local_78._0_4_,cx,cy);
          }
          auVar22 = local_68;
          uVar19 = uVar31;
          uVar13 = local_78._0_8_;
          iVar12 = iVar33;
          if ((bVar26 & 1) == 0) {
            auVar22 = (undefined1  [8])uVar21;
            uVar13 = uVar31;
            if ((vertices[lVar16 + 1].type & 1) == 0) {
              uVar21 = (ulong)(uint)((int)((int)vertices[lVar16 + 1].x + uVar20) >> 1);
              uVar19 = (ulong)(uint)((int)((int)vertices[lVar16 + 1].y + uVar30) >> 1);
            }
            else {
              uVar21 = (ulong)(uint)(int)vertices[lVar16 + 1].x;
              uVar19 = (ulong)(uint)(int)vertices[lVar16 + 1].y;
              iVar12 = iVar33 + 1;
            }
          }
          uVar23 = bVar26 & 1 ^ 1;
          vertices[num_vertices].type = '\x01';
          vertices[num_vertices].x = (short)uVar21;
          vertices[num_vertices].y = (short)uVar19;
          vertices[num_vertices].cx = 0;
          vertices[num_vertices].cy = 0;
          iVar33 = (ushort)(*(ushort *)(local_38 + (long)iVar18 * 2) << 8 |
                           *(ushort *)(local_38 + (long)iVar18 * 2) >> 8) + 1;
          iVar18 = iVar18 + 1;
          iVar36 = 0;
          local_68 = auVar22;
          local_78._0_8_ = uVar13;
          uVar13 = uVar21;
          num_vertices = num_vertices + 1;
        }
        else {
          sVar17 = (short)local_a8;
          if ((bVar26 & 1) == 0) {
            local_a8 = uVar31;
            if (iVar36 == 0) {
              iVar36 = 1;
              local_a0 = uVar21;
            }
            else {
              vertices[num_vertices].type = '\x03';
              vertices[num_vertices].x = (short)(cx + uVar20 >> 1);
              vertices[num_vertices].y = (short)(uVar30 + cy >> 1);
              vertices[num_vertices].cx = (short)local_a0;
              vertices[num_vertices].cy = sVar17;
              iVar36 = 1;
              num_vertices = num_vertices + 1;
              local_a0 = uVar21;
            }
          }
          else {
            psVar29 = vertices + num_vertices;
            if (iVar36 == 0) {
              psVar29->type = '\x02';
              psVar29->x = sVar28;
              psVar29->y = sVar3;
              psVar29->cx = 0;
              sVar17 = 0;
            }
            else {
              psVar29->type = '\x03';
              psVar29->x = sVar28;
              psVar29->y = sVar3;
              psVar29->cx = (short)local_a0;
            }
            psVar29->cy = sVar17;
            num_vertices = num_vertices + 1;
            iVar36 = 0;
          }
        }
        iVar12 = iVar12 + 1;
      }
      uVar11 = stbtt__close_shape(vertices,num_vertices,iVar36,uVar23,(stbtt_int32)uVar13,
                                  (stbtt_int32)uVar19,local_68._0_4_,local_78._0_4_,cx,cy);
    }
    *local_40 = vertices;
  }
  return uVar11;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}